

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testCenter<Imath_3_2::Vec3<double>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  double *pdVar5;
  char *in_RDI;
  double dVar6;
  Box<Imath_3_2::Vec3<double>_> b_1;
  Vec3<double> max;
  Vec3<double> min;
  Box<Imath_3_2::Vec3<double>_> b1;
  int hi;
  int lo;
  uint i;
  Vec3<double> p1;
  Vec3<double> p0;
  Box<Imath_3_2::Vec3<double>_> b0;
  Box<Imath_3_2::Vec3<double>_> b;
  Box<Imath_3_2::Vec3<double>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  Box<Imath_3_2::Vec3<double>_> *in_stack_fffffffffffffdc0;
  Box<Imath_3_2::Vec3<double>_> *in_stack_fffffffffffffdc8;
  Vec3<double> local_228 [3];
  Vec3<double> local_1e0;
  Vec3<double> local_1c8 [2];
  Vec3<double> local_198;
  Vec3<double> local_180 [3];
  int local_134;
  int local_130;
  uint local_12c;
  Vec3<double> local_128;
  Vec3<double> local_110;
  Vec3<double> local_f8;
  Vec3<double> local_e0;
  Vec3<double> local_c8;
  Vec3<double> local_b0 [3];
  Vec3<double> local_68;
  Vec3<double> local_50 [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box(in_stack_fffffffffffffdb0);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::center(in_stack_fffffffffffffdc8);
  Imath_3_2::Vec3<double>::Vec3(&local_68,0.0);
  bVar1 = Imath_3_2::Vec3<double>::operator==(local_50,&local_68);
  if (!bVar1) {
    __assert_fail("b.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2a2,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  Imath_3_2::Vec3<double>::Vec3(local_b0,-1.0);
  Imath_3_2::Vec3<double>::Vec3(&local_c8,1.0);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box
            (in_stack_fffffffffffffdc0,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             &in_stack_fffffffffffffdb0->min);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::center(in_stack_fffffffffffffdc8);
  Imath_3_2::Vec3<double>::Vec3(&local_f8,0.0);
  bVar1 = Imath_3_2::Vec3<double>::operator==(&local_e0,&local_f8);
  if (!bVar1) {
    __assert_fail("b0.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2b4,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  Imath_3_2::Vec3<double>::Vec3(&local_110);
  Imath_3_2::Vec3<double>::Vec3(&local_128);
  local_12c = 0;
  while( true ) {
    uVar3 = local_12c;
    uVar2 = Imath_3_2::Vec3<double>::dimensions();
    if (uVar2 <= uVar3) break;
    local_130 = 1 << ((char)local_12c + 1U & 0x1f);
    uVar3 = Imath_3_2::Vec3<double>::dimensions();
    local_134 = 1 << ((char)uVar3 - (char)local_12c & 0x1fU);
    dVar6 = (double)local_130;
    pdVar5 = Imath_3_2::Vec3<double>::operator[](&local_110,local_12c);
    *pdVar5 = -dVar6;
    in_stack_fffffffffffffdb0 = (Box<Imath_3_2::Vec3<double>_> *)(double)local_134;
    pdVar5 = Imath_3_2::Vec3<double>::operator[](&local_128,local_12c);
    *pdVar5 = (double)in_stack_fffffffffffffdb0;
    local_12c = local_12c + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box
            (in_stack_fffffffffffffdc0,(Vec3<double> *)CONCAT44(uVar3,in_stack_fffffffffffffdb8),
             &in_stack_fffffffffffffdb0->min);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::center(in_stack_fffffffffffffdc8);
  Imath_3_2::Vec3<double>::operator+
            ((Vec3<double> *)CONCAT44(uVar3,in_stack_fffffffffffffdb8),
             &in_stack_fffffffffffffdb0->min);
  Imath_3_2::Vec3<double>::operator/
            ((Vec3<double> *)CONCAT44(uVar3,in_stack_fffffffffffffdb8),
             (double)in_stack_fffffffffffffdb0);
  bVar1 = Imath_3_2::Vec3<double>::operator==(local_180,&local_198);
  if (!bVar1) {
    __assert_fail("b1.center () == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2c0,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  Imath_3_2::Vec3<double>::Vec3(local_1c8,0.0);
  Imath_3_2::Vec3<double>::Vec3(&local_1e0,local_1c8);
  uVar2 = Imath_3_2::Vec3<double>::dimensions();
  pdVar5 = Imath_3_2::Vec3<double>::operator[](&local_1e0,uVar2 - 1);
  *pdVar5 = 2.0;
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::Box
            (in_stack_fffffffffffffdc0,(Vec3<double> *)CONCAT44(uVar3,in_stack_fffffffffffffdb8),
             &in_stack_fffffffffffffdb0->min);
  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::center(in_stack_fffffffffffffdc8);
  Imath_3_2::Vec3<double>::operator/
            ((Vec3<double> *)CONCAT44(uVar3,in_stack_fffffffffffffdb8),
             (double)in_stack_fffffffffffffdb0);
  bVar1 = Imath_3_2::Vec3<double>::operator==(local_228,(Vec3<double> *)&stack0xfffffffffffffdc0);
  if (!bVar1) {
    __assert_fail("b.center () == max / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2d1,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<double>]"
                 );
  }
  return;
}

Assistant:

void
testCenter (const char* type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (b.center () == T (0));
    }

    //
    // Center of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ]
    //
    // and
    //
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.center () == T (0));

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (b1.center () == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (b.center () == max / 2);
    }
}